

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O3

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator--(BigInt<unsigned_int,_unsigned_long> *this)

{
  uint *__s;
  uint *puVar1;
  iterator __position;
  uint local_c;
  
  if (this->_positive == false) {
    this->_positive = true;
    operator++(this);
  }
  else {
    __s = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
    __position._M_current =
         (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar1 = __s;
    if (__s != __position._M_current) {
      do {
        if (*puVar1 != 0) {
          *puVar1 = *puVar1 - 1;
          __position._M_current = puVar1;
          break;
        }
        puVar1 = puVar1 + 1;
      } while (puVar1 != __position._M_current);
      if (__s == __position._M_current) {
        return this;
      }
      memset(__s,0xff,((long)__position._M_current + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
      return this;
    }
    local_c = 1;
    if (__s == (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->_values,__position,&local_c);
    }
    else {
      *__position._M_current = 1;
      (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  this->_positive = false;
  return this;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator--()
	{
		if (!_positive)
		{
			_positive = true;
			++(*this);
			_positive = false;

			return *this;
		}

		if (_values.empty())
		{
			_values.push_back(1);
			_positive = false;
			return *this;
		}

		auto it = _values.begin();
		const auto itEnd = _values.cend();
		while (it != itEnd)
		{
			if (*it != 0)
			{
				--(*it);
				break;
			}
			++it;
		}

		std::fill(_values.begin(), it, _baseMax);

		return *this;
	}